

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

double __thiscall
HighsLpRelaxation::computeBestEstimate(HighsLpRelaxation *this,HighsPseudocost *ps)

{
  pointer ppVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  long lVar3;
  long lVar4;
  const_iterator __begin2;
  pointer ppVar5;
  const_iterator __end2;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double offset;
  double dVar11;
  
  dVar10 = this->objective;
  ppVar5 = (this->fractionalints).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->fractionalints).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 == ppVar1) {
    dVar11 = 0.0;
  }
  else {
    _Var2._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    dVar11 = 1.0;
    if (1.0 <= ABS(dVar10)) {
      dVar11 = ABS(dVar10);
    }
    lVar3 = (long)*(pointer *)((long)&(_Var2._M_head_impl)->integral_cols + 8) -
            *(long *)&((_Var2._M_head_impl)->integral_cols).
                      super__Vector_base<int,_std::allocator<int>_>;
    lVar4 = lVar3 >> 2;
    auVar9._8_4_ = (int)(lVar3 >> 0x22);
    auVar9._0_8_ = lVar4;
    auVar9._12_4_ = 0x45300000;
    offset = (dVar11 * (_Var2._M_head_impl)->feastol) /
             ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    dVar8 = 0.0;
    dVar11 = 0.0;
    for (; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
      dVar6 = HighsPseudocost::getPseudocostUp(ps,ppVar5->first,ppVar5->second,offset);
      dVar7 = HighsPseudocost::getPseudocostDown(ps,ppVar5->first,ppVar5->second,offset);
      if (dVar6 <= dVar7) {
        dVar7 = dVar6;
      }
      dVar6 = dVar11 + dVar7;
      dVar8 = dVar8 + (dVar11 - (dVar6 - dVar7)) + (dVar7 - (dVar6 - (dVar6 - dVar7)));
      dVar11 = dVar6;
    }
    dVar11 = dVar11 + dVar8;
    dVar8 = dVar10 + dVar11;
    dVar11 = (dVar10 - (dVar8 - dVar11)) + (dVar11 - (dVar8 - (dVar8 - dVar11))) + 0.0;
    dVar10 = dVar8;
  }
  return dVar10 + dVar11;
}

Assistant:

double HighsLpRelaxation::computeBestEstimate(const HighsPseudocost& ps) const {
  HighsCDouble estimate = objective;

  if (!fractionalints.empty()) {
    // because the pseudocost may be zero, we add an offset to the pseudocost so
    // that we always have some part of the estimate depending on the
    // fractionality.

    HighsCDouble increase = 0.0;
    double offset =
        mipsolver.mipdata_->feastol * std::max(std::abs(objective), 1.0) /
        static_cast<double>(mipsolver.mipdata_->integral_cols.size());

    for (const std::pair<HighsInt, double>& f : fractionalints) {
      increase += std::min(ps.getPseudocostUp(f.first, f.second, offset),
                           ps.getPseudocostDown(f.first, f.second, offset));
    }

    estimate += double(increase);
  }

  return double(estimate);
}